

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserOpenSim.h
# Opt level: O2

bool chrono::utils::ChParserOpenSim::CStrToBool(char *string)

{
  __type_conflict _Var1;
  char *in_RDX;
  allocator local_59;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  stringStripCStr_abi_cxx11_(&local_58,(ChParserOpenSim *)string,in_RDX);
  std::__cxx11::string::string((string *)&local_38,"true",&local_59);
  _Var1 = std::operator==(&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return _Var1;
}

Assistant:

static inline bool CStrToBool(const char* string) { return stringStripCStr(string) == std::string("true"); }